

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrapper-api.c
# Opt level: O0

uint64_t tlv_decode_segno(name_component_t *comp)

{
  name_component_t *local_28;
  uint64_t ret;
  int i;
  name_component_t *comp_local;
  
  local_28 = (name_component_t *)0x0;
  if (((comp->type == 8) && (1 < comp->size)) && (comp->value[0] == '\0')) {
    for (ret._4_4_ = 1; ret._4_4_ < (int)(uint)comp->size; ret._4_4_ = ret._4_4_ + 1) {
      local_28 = (name_component_t *)((long)local_28 * 0x100 + (ulong)comp->value[ret._4_4_]);
    }
    comp_local = local_28;
  }
  else {
    comp_local = (name_component_t *)0xffffffffffffffff;
  }
  return (uint64_t)comp_local;
}

Assistant:

uint64_t
tlv_decode_segno(name_component_t* comp)
{
  int i;
  uint64_t ret = 0;

  if (comp->type != TLV_GenericNameComponent ||
     comp->size < 2 ||
     comp->value[0] != 0) {
    return (uint64_t)-1;
  }
  for (i = 1; i < comp->size; i ++) {
    ret = ret * 0x100 + comp->value[i];
  }
  return ret;
}